

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O2

int AF_AActor_A_Quake(VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,
                     VMReturn *ret,int numret)

{
  VMValue *pVVar1;
  VMValue *pVVar2;
  VMValue *pVVar3;
  VMValue *pVVar4;
  bool bVar5;
  char *pcVar6;
  AActor *activator;
  FSoundID local_24;
  
  if (numparam < 1) {
    pcVar6 = "(paramnum) < numparam";
    goto LAB_003ea194;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003ea184:
    pcVar6 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003ea194:
    __assert_fail(pcVar6,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0x1428,
                  "int AF_AActor_A_Quake(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  activator = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (activator == (AActor *)0x0) goto LAB_003ea0de;
    bVar5 = DObject::IsKindOf((DObject *)activator,AActor::RegistrationInfo.MyClass);
    if (!bVar5) {
      pcVar6 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003ea194;
    }
  }
  else {
    if (activator != (AActor *)0x0) goto LAB_003ea184;
LAB_003ea0de:
    activator = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar6 = "(paramnum) < numparam";
  }
  else {
    if (param[1].field_0.field_3.Type == '\0') {
      if ((uint)numparam < 3) {
        pcVar6 = "(paramnum) < numparam";
      }
      else {
        if (param[2].field_0.field_3.Type == '\0') {
          if (numparam == 3) {
            pcVar6 = "(paramnum) < numparam";
          }
          else {
            if (param[3].field_0.field_3.Type == '\0') {
              if ((uint)numparam < 5) {
                pcVar6 = "(paramnum) < numparam";
              }
              else {
                if (param[4].field_0.field_3.Type == '\0') {
                  pVVar1 = param + 1;
                  pVVar2 = param + 2;
                  pVVar3 = param + 3;
                  pVVar4 = param + 4;
                  if (numparam == 5) {
                    param = defaultparam->Array;
                    if (param[5].field_0.field_3.Type == '\0') {
LAB_003ea15f:
                      local_24.ID = param[5].field_0.i;
                      P_StartQuake(activator,0,(pVVar1->field_0).i,(pVVar2->field_0).i,
                                   (pVVar3->field_0).i,(pVVar4->field_0).i,&local_24);
                      return 0;
                    }
                    pcVar6 = "(defaultparam[paramnum]).Type == REGT_INT";
                  }
                  else {
                    if (param[5].field_0.field_3.Type == '\0') goto LAB_003ea15f;
                    pcVar6 = "(param[paramnum]).Type == REGT_INT";
                  }
                  __assert_fail(pcVar6,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                                ,0x142d,
                                "int AF_AActor_A_Quake(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                               );
                }
                pcVar6 = "param[paramnum].Type == REGT_INT";
              }
              __assert_fail(pcVar6,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x142c,
                            "int AF_AActor_A_Quake(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
            pcVar6 = "param[paramnum].Type == REGT_INT";
          }
          __assert_fail(pcVar6,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x142b,
                        "int AF_AActor_A_Quake(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
          ;
        }
        pcVar6 = "param[paramnum].Type == REGT_INT";
      }
      __assert_fail(pcVar6,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x142a,
                    "int AF_AActor_A_Quake(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    pcVar6 = "param[paramnum].Type == REGT_INT";
  }
  __assert_fail(pcVar6,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x1429,"int AF_AActor_A_Quake(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
  ;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_Quake)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT		(intensity);
	PARAM_INT		(duration);
	PARAM_INT		(damrad);
	PARAM_INT		(tremrad);
	PARAM_SOUND_DEF	(sound);

	P_StartQuake(self, 0, intensity, duration, damrad, tremrad, sound);
	return 0;
}